

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_openssl.c
# Opt level: O1

int amqp_ssl_socket_set_key_buffer(amqp_socket_t *base,char *cert,void *key,size_t n)

{
  int iVar1;
  BIO *bp;
  RSA *rsa;
  int iVar2;
  RSA *r;
  
  if (base->klass != &amqp_ssl_socket_class) {
    amqp_abort("<%p> is not of type amqp_ssl_socket_t",base);
  }
  iVar1 = SSL_CTX_use_certificate_chain_file((SSL_CTX *)base[1].klass,cert);
  iVar2 = -0x200;
  if (iVar1 == 1) {
    bp = BIO_new_mem_buf(key,(int)n);
    iVar2 = -0x200;
    if (bp == (BIO *)0x0) {
      r = (RSA *)0x0;
    }
    else {
      rsa = PEM_read_bio_RSAPrivateKey(bp,(RSA **)0x0,password_cb,(void *)0x0);
      r = (RSA *)0x0;
      if (rsa != (RSA *)0x0) {
        iVar1 = SSL_CTX_use_RSAPrivateKey((SSL_CTX *)base[1].klass,rsa);
        iVar2 = -0x200;
        r = rsa;
        if (iVar1 == 1) {
          iVar2 = 1;
        }
      }
    }
    BIO_vfree(bp);
    RSA_free(r);
  }
  return iVar2;
}

Assistant:

int
amqp_ssl_socket_set_key_buffer(amqp_socket_t *base,
                               const char *cert,
                               const void *key,
                               size_t n)
{
  int status = AMQP_STATUS_OK;
  BIO *buf = NULL;
  RSA *rsa = NULL;
  struct amqp_ssl_socket_t *self;
  if (base->klass != &amqp_ssl_socket_class) {
    amqp_abort("<%p> is not of type amqp_ssl_socket_t", base);
  }
  self = (struct amqp_ssl_socket_t *)base;
  status = SSL_CTX_use_certificate_chain_file(self->ctx, cert);
  if (1 != status) {
    return AMQP_STATUS_SSL_ERROR;
  }
  buf = BIO_new_mem_buf((void *)key, n);
  if (!buf) {
    goto error;
  }
  rsa = PEM_read_bio_RSAPrivateKey(buf, NULL, password_cb, NULL);
  if (!rsa) {
    goto error;
  }
  status = SSL_CTX_use_RSAPrivateKey(self->ctx, rsa);
  if (1 != status) {
    goto error;
  }
exit:
  BIO_vfree(buf);
  RSA_free(rsa);
  return status;
error:
  status = AMQP_STATUS_SSL_ERROR;
  goto exit;
}